

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  stbi__context *psVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  stbi_uc *psVar9;
  ulong uVar11;
  stbi_uc *psVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  stbi_uc *psVar20;
  uint uVar21;
  uint uVar22;
  stbi_uc *__dest;
  byte bVar23;
  int iVar24;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  byte *pbVar29;
  ulong uVar30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  byte *pbVar34;
  long lVar35;
  bool bVar36;
  ulong local_60;
  ulong uVar10;
  
  bVar36 = depth == 0x10;
  uVar3 = x * out_n;
  uVar4 = uVar3 << bVar36;
  psVar2 = a->s;
  iVar18 = psVar2->img_n;
  uVar5 = iVar18 << bVar36;
  if (iVar18 + 1 != out_n && iVar18 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                  ,0xfb2,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar9 = (stbi_uc *)malloc((ulong)((out_n << bVar36) * y * x));
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar17 = iVar18 * x;
  uVar6 = uVar17 * depth + 7 >> 3;
  uVar10 = (ulong)uVar6;
  uVar7 = (uVar6 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar7 == raw_len) {
LAB_001699b0:
      if (y == 0) {
joined_r0x0016a0e3:
        if (depth != 0x10) {
          return 1;
        }
LAB_0016a0e5:
        iVar18 = y * x * out_n;
        if (iVar18 != 0) {
          psVar9 = a->out;
          lVar13 = 0;
          do {
            puVar1 = (ushort *)(psVar9 + lVar13 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar13 = lVar13 + 1;
          } while (iVar18 != (int)lVar13);
          return 1;
        }
        return 1;
      }
      bVar23 = *raw;
      if (4 < bVar23) {
        stbi__g_failure_reason = "invalid filter";
        return 0;
      }
      lVar13 = (long)iVar18;
      uVar30 = (ulong)uVar4;
      lVar14 = (long)(out_n << bVar36);
      iVar8 = x - 1;
      uVar11 = (ulong)y;
      psVar9 = a->out;
      lVar15 = -lVar14;
      uVar19 = 0;
      lVar35 = 0;
      local_60 = (ulong)x;
      do {
        psVar12 = psVar9;
        if (depth < 8) {
          if (x < uVar6) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                          ,0xfc7,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          psVar12 = psVar9 + (uVar3 - uVar6);
          uVar5 = 1;
          local_60 = uVar10;
        }
        if (lVar35 == 0) {
          bVar23 = ""[bVar23];
        }
        if (0 < (int)uVar5) {
          uVar26 = 0;
          do {
            switch(bVar23) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar31 = raw[uVar26 + 1];
              goto LAB_00169b10;
            case 2:
            case 4:
              bVar31 = psVar9[uVar26 - uVar30];
              break;
            case 3:
              bVar31 = psVar9[uVar26 - uVar30] >> 1;
              break;
            default:
              goto switchD_00169af7_default;
            }
            bVar31 = bVar31 + raw[uVar26 + 1];
LAB_00169b10:
            psVar12[uVar26] = bVar31;
switchD_00169af7_default:
            uVar26 = uVar26 + 1;
          } while (uVar5 != uVar26);
        }
        if (depth == 8) {
          lVar27 = (long)out_n;
          lVar16 = lVar13;
          if (iVar18 != out_n) {
            psVar12[lVar13] = 0xff;
          }
LAB_00169b73:
          raw = raw + lVar16 + 1;
        }
        else {
          if (depth == 0x10) {
            lVar16 = (long)(int)uVar5;
            lVar27 = lVar14;
            if (iVar18 != out_n) {
              psVar12[lVar16] = 0xff;
              psVar12[lVar16 + 1] = 0xff;
            }
            goto LAB_00169b73;
          }
          raw = raw + 2;
          lVar27 = 1;
        }
        __dest = psVar12 + lVar27;
        psVar20 = psVar9 + (lVar27 - uVar30);
        if (depth < 8 || iVar18 == out_n) {
          uVar7 = ((int)local_60 + -1) * uVar5;
          switch(bVar23) {
          case 0:
            memcpy(__dest,raw,(long)(int)uVar7);
            break;
          case 1:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                __dest[uVar19] = psVar12[uVar19 + (lVar27 - (int)uVar5)] + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
            break;
          case 2:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                __dest[uVar19] = psVar20[uVar19] + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
            break;
          case 3:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                __dest[uVar19] =
                     (char)((uint)psVar12[uVar19 + (lVar27 - (int)uVar5)] + (uint)psVar20[uVar19] >>
                           1) + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
            break;
          case 4:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                bVar23 = psVar12[uVar19 + (lVar27 - (int)uVar5)];
                bVar31 = psVar20[uVar19];
                bVar25 = psVar9[uVar19 + ((lVar27 - (int)uVar5) - uVar30)];
                iVar32 = ((uint)bVar31 + (uint)bVar23) - (uint)bVar25;
                uVar22 = iVar32 - (uint)bVar23;
                uVar21 = -uVar22;
                if (0 < (int)uVar22) {
                  uVar21 = uVar22;
                }
                uVar28 = iVar32 - (uint)bVar31;
                uVar22 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar22 = uVar28;
                }
                uVar33 = iVar32 - (uint)bVar25;
                uVar28 = -uVar33;
                if (0 < (int)uVar33) {
                  uVar28 = uVar33;
                }
                if (uVar22 <= uVar28) {
                  bVar25 = bVar31;
                }
                if (uVar28 < uVar21) {
                  bVar23 = bVar25;
                }
                if (uVar22 < uVar21) {
                  bVar23 = bVar25;
                }
                __dest[uVar19] = bVar23 + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
            break;
          case 5:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                __dest[uVar19] = (psVar12[uVar19 + (lVar27 - (int)uVar5)] >> 1) + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
            break;
          case 6:
            if (0 < (int)uVar7) {
              uVar19 = 0;
              do {
                __dest[uVar19] = psVar12[uVar19 + (lVar27 - (int)uVar5)] + raw[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
            }
          }
          raw = raw + (int)uVar7;
LAB_0016a078:
          if (lVar35 + 1U == uVar11) {
            if (depth < 8) {
              if (y == 0) {
                return 1;
              }
              uVar6 = x - 1;
              lVar13 = uVar3 - uVar10;
              lVar14 = (ulong)uVar6 + 1;
              uVar5 = 0;
              uVar30 = 0;
              do {
                bVar23 = 1;
                if (color == 0) {
                  bVar23 = ""[depth];
                }
                psVar9 = a->out;
                pbVar29 = psVar9 + uVar4 * (int)uVar30;
                pbVar34 = pbVar29 + (uVar3 - uVar10);
                uVar19 = (ulong)uVar5;
                if (depth == 4) {
                  uVar7 = uVar17;
                  if (1 < (int)uVar17) {
                    psVar12 = psVar9 + lVar13;
                    uVar21 = uVar17;
                    do {
                      psVar9[uVar19] = (psVar12[uVar19] >> 4) * bVar23;
                      psVar9[uVar19 + 1] = (psVar12[uVar19] & 0xf) * bVar23;
                      uVar7 = uVar21 - 2;
                      psVar12 = psVar12 + 1;
                      psVar9 = psVar9 + 2;
                      bVar36 = 3 < uVar21;
                      uVar21 = uVar7;
                    } while (bVar36);
                    pbVar34 = psVar12 + uVar19;
                    pbVar29 = psVar9 + uVar19;
                  }
                  if (uVar7 == 1) {
                    *pbVar29 = (*pbVar34 >> 4) * bVar23;
                  }
                }
                else if (depth == 2) {
                  uVar7 = uVar17;
                  if (3 < (int)uVar17) {
                    psVar12 = psVar9 + lVar13;
                    uVar21 = uVar17;
                    do {
                      psVar9[uVar19] = (psVar12[uVar19] >> 6) * bVar23;
                      psVar9[uVar19 + 1] = (psVar12[uVar19] >> 4 & 3) * bVar23;
                      psVar9[uVar19 + 2] = (psVar12[uVar19] >> 2 & 3) * bVar23;
                      psVar9[uVar19 + 3] = (psVar12[uVar19] & 3) * bVar23;
                      uVar7 = uVar21 - 4;
                      psVar12 = psVar12 + 1;
                      psVar9 = psVar9 + 4;
                      bVar36 = 7 < uVar21;
                      uVar21 = uVar7;
                    } while (bVar36);
                    pbVar34 = psVar12 + uVar19;
                    pbVar29 = psVar9 + uVar19;
                  }
                  if (((0 < (int)uVar7) && (*pbVar29 = (*pbVar34 >> 6) * bVar23, uVar7 != 1)) &&
                     (pbVar29[1] = (*pbVar34 >> 4 & 3) * bVar23, uVar7 == 3)) {
                    pbVar29[2] = (*pbVar34 >> 2 & 3) * bVar23;
                  }
                }
                else if (depth == 1) {
                  uVar7 = uVar17;
                  if (7 < (int)uVar17) {
                    psVar12 = psVar9 + lVar13;
                    uVar21 = uVar17;
                    do {
                      psVar9[uVar19] = (char)psVar12[uVar19] >> 7 & bVar23;
                      psVar9[uVar19 + 1] = (char)(psVar12[uVar19] * '\x02') >> 7 & bVar23;
                      psVar9[uVar19 + 2] = (char)(psVar12[uVar19] << 2) >> 7 & bVar23;
                      psVar9[uVar19 + 3] = (char)(psVar12[uVar19] << 3) >> 7 & bVar23;
                      psVar9[uVar19 + 4] = (char)(psVar12[uVar19] << 4) >> 7 & bVar23;
                      psVar9[uVar19 + 5] = (char)(psVar12[uVar19] << 5) >> 7 & bVar23;
                      psVar9[uVar19 + 6] = (char)(psVar12[uVar19] << 6) >> 7 & bVar23;
                      bVar31 = bVar23;
                      if ((psVar12[uVar19] & 1) == 0) {
                        bVar31 = 0;
                      }
                      psVar9[uVar19 + 7] = bVar31;
                      uVar7 = uVar21 - 8;
                      psVar12 = psVar12 + 1;
                      psVar9 = psVar9 + 8;
                      bVar36 = 0xf < uVar21;
                      uVar21 = uVar7;
                    } while (bVar36);
                    pbVar34 = psVar12 + uVar19;
                    pbVar29 = psVar9 + uVar19;
                  }
                  if (((((0 < (int)uVar7) && (*pbVar29 = (char)*pbVar34 >> 7 & bVar23, uVar7 != 1))
                       && ((pbVar29[1] = (char)(*pbVar34 * '\x02') >> 7 & bVar23, 2 < uVar7 &&
                           ((pbVar29[2] = (char)(*pbVar34 << 2) >> 7 & bVar23, uVar7 != 3 &&
                            (pbVar29[3] = (char)(*pbVar34 << 3) >> 7 & bVar23, 4 < uVar7)))))) &&
                      (pbVar29[4] = (char)(*pbVar34 << 4) >> 7 & bVar23, uVar7 != 5)) &&
                     (pbVar29[5] = (char)(*pbVar34 << 5) >> 7 & bVar23, uVar7 == 7)) {
                    pbVar29[6] = (char)(*pbVar34 << 6) >> 7 & bVar23;
                  }
                }
                if (iVar18 != out_n) {
                  psVar9 = a->out;
                  if (iVar18 == 1) {
                    lVar15 = lVar14;
                    if (-1 < (int)uVar6) {
                      do {
                        psVar9[lVar15 * 2 + (uVar19 - 1)] = 0xff;
                        psVar9[lVar15 * 2 + (uVar19 - 2)] = psVar9[lVar15 + (uVar19 - 1)];
                        lVar35 = lVar15 + -1;
                        bVar36 = 0 < lVar15;
                        lVar15 = lVar35;
                      } while (lVar35 != 0 && bVar36);
                    }
                  }
                  else {
                    if (iVar18 != 3) {
                      __assert_fail("img_n == 3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                                    ,0x105d,
                                    "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                   );
                    }
                    if (-1 < (int)uVar6) {
                      psVar12 = psVar9 + (ulong)uVar6 * 3 + 2 + uVar19;
                      lVar15 = lVar14;
                      do {
                        psVar9[lVar15 * 4 + (uVar19 - 1)] = 0xff;
                        psVar9[lVar15 * 4 + (uVar19 - 2)] = *psVar12;
                        psVar9[lVar15 * 4 + (uVar19 - 3)] = psVar12[-1];
                        psVar9[lVar15 * 4 + (uVar19 - 4)] = psVar12[-2];
                        psVar12 = psVar12 + -3;
                        lVar35 = lVar15 + -1;
                        bVar36 = 0 < lVar15;
                        lVar15 = lVar35;
                      } while (lVar35 != 0 && bVar36);
                    }
                  }
                }
                uVar30 = uVar30 + 1;
                uVar5 = uVar5 + uVar4;
              } while (uVar30 != uVar11);
              return 1;
            }
            goto joined_r0x0016a0e3;
          }
        }
        else {
          if (iVar18 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                          ,0x1004,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(bVar23) {
          case 0:
            if (iVar8 != 0) {
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] = raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 1:
            if (iVar8 != 0) {
              psVar12 = psVar12 + lVar27 + lVar15;
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] = psVar12[uVar26] + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar12 = psVar12 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 2:
            if (iVar8 != 0) {
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] = psVar20[uVar26] + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar20 = psVar20 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 3:
            if (iVar8 != 0) {
              psVar12 = psVar12 + lVar27 + lVar15;
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] =
                         (char)((uint)psVar12[uVar26] + (uint)psVar20[uVar26] >> 1) + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar20 = psVar20 + lVar14;
                psVar12 = psVar12 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 4:
            if (iVar8 != 0) {
              psVar12 = psVar12 + lVar27 + lVar15;
              psVar9 = psVar9 + lVar27 + (lVar15 - uVar30);
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    bVar23 = psVar12[uVar26];
                    bVar31 = psVar20[uVar26];
                    bVar25 = psVar9[uVar26];
                    iVar24 = ((uint)bVar31 + (uint)bVar23) - (uint)bVar25;
                    uVar21 = iVar24 - (uint)bVar23;
                    uVar7 = -uVar21;
                    if (0 < (int)uVar21) {
                      uVar7 = uVar21;
                    }
                    uVar22 = iVar24 - (uint)bVar31;
                    uVar21 = -uVar22;
                    if (0 < (int)uVar22) {
                      uVar21 = uVar22;
                    }
                    uVar28 = iVar24 - (uint)bVar25;
                    uVar22 = -uVar28;
                    if (0 < (int)uVar28) {
                      uVar22 = uVar28;
                    }
                    if (uVar21 <= uVar22) {
                      bVar25 = bVar31;
                    }
                    if (uVar22 < uVar7) {
                      bVar23 = bVar25;
                    }
                    if (uVar21 < uVar7) {
                      bVar23 = bVar25;
                    }
                    __dest[uVar26] = bVar23 + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar20 = psVar20 + lVar14;
                psVar12 = psVar12 + lVar14;
                psVar9 = psVar9 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 5:
            if (iVar8 != 0) {
              psVar12 = psVar12 + lVar27 + lVar15;
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] = (psVar12[uVar26] >> 1) + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar12 = psVar12 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
            break;
          case 6:
            if (iVar8 != 0) {
              psVar12 = psVar12 + lVar27 + lVar15;
              iVar32 = iVar8;
              do {
                if (0 < (int)uVar5) {
                  uVar26 = 0;
                  do {
                    __dest[uVar26] = psVar12[uVar26] + raw[uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar5 != uVar26);
                }
                __dest[(int)uVar5] = 0xff;
                raw = raw + (int)uVar5;
                __dest = __dest + lVar14;
                psVar12 = psVar12 + lVar14;
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
            }
          }
          if (depth != 0x10) goto LAB_0016a078;
          if (x != 0) {
            psVar9 = a->out + (long)(int)uVar5 + uVar19 + 1;
            uVar19 = (ulong)x;
            do {
              *psVar9 = 0xff;
              psVar9 = psVar9 + lVar14;
              uVar7 = (int)uVar19 - 1;
              uVar19 = (ulong)uVar7;
            } while (uVar7 != 0);
            goto LAB_0016a078;
          }
          if (lVar35 + 1U == uVar11) goto LAB_0016a0e5;
        }
        lVar35 = lVar35 + 1;
        uVar19 = (ulong)(uVar4 * (int)lVar35);
        psVar9 = a->out + uVar19;
        bVar23 = *raw;
        if (4 < bVar23) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
      } while( true );
    }
  }
  else if (uVar7 <= raw_len) goto LAB_001699b0;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * output_bytes); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); break;
         }
         #undef CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            int q;
            // insert alpha = 255
            cur = a->out + stride*j;
            if (img_n == 1) {
               for (q=x-1; q >= 0; --q) {
                  cur[q*2+1] = 255;
                  cur[q*2+0] = cur[q];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (q=x-1; q >= 0; --q) {
                  cur[q*4+3] = 255;
                  cur[q*4+2] = cur[q*3+2];
                  cur[q*4+1] = cur[q*3+1];
                  cur[q*4+0] = cur[q*3+0];
               }
            }
         }
      }
   } else if (depth == 16) {
      // force the image data from big-endian to platform-native.
      // this is done in a separate pass due to the decoding relying
      // on the data being untouched, but could probably be done
      // per-line during decode if care is taken.
      stbi_uc *cur = a->out;
      stbi__uint16 *cur16 = (stbi__uint16*)cur;

      for(i=0; i < x*y*out_n; ++i,cur16++,cur+=2) {
         *cur16 = (cur[0] << 8) | cur[1];
      }
   }

   return 1;
}